

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O2

void __thiscall
gpu::BlendFilters<unsigned_char>::hardMix
          (BlendFilters<unsigned_char> *this,uchar *baseLayer,uchar *blendLayer,uchar *destination,
          float alpha)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  float fVar4;
  float fVar5;
  
  bVar1 = *blendLayer;
  if ((char)bVar1 < '\0') {
    bVar3 = *baseLayer;
    uVar2 = ((uint)bVar3 << 8) / ((uint)(ushort)bVar1 * 2 ^ 0x1ff);
    if ((ushort)uVar2 < 0x100) goto LAB_00141e54;
  }
  else {
    bVar3 = *baseLayer;
    fVar5 = 0.0;
    if ((bVar1 == 0) ||
       (uVar2 = ((uint)(byte)~bVar3 << 8) / ((uint)(ushort)bVar1 * 2), 0xff < (ushort)uVar2))
    goto LAB_00141e66;
    uVar2 = 0xff - uVar2;
LAB_00141e54:
    if (uVar2 < 0x80) {
      fVar5 = 0.0;
      goto LAB_00141e66;
    }
  }
  fVar5 = 255.0;
LAB_00141e66:
  fVar5 = fVar5 * alpha + (float)bVar3 * (1.0 - alpha);
  fVar4 = 255.0;
  if ((fVar5 <= 255.0) && (fVar4 = fVar5, fVar5 < 0.0)) {
    fVar4 = 0.0;
  }
  *destination = (uchar)(int)fVar4;
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::hardMix(const T& baseLayer,const T& blendLayer, T& destination, float alpha)
    {
      float blendValue=ChannelBlend_HardMix(baseLayer,blendLayer);
      float blendValueNormalized=(1.0-alpha)*baseLayer+alpha*blendValue;
      PIXEL_DOMAIN_CHECK(blendValueNormalized);
      destination=(T)blendValueNormalized;
    }